

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsMouseDragPastThreshold(ImGuiMouseButton button,float lock_threshold)

{
  uint in_EDI;
  float in_XMM0_Da;
  ImGuiContext *g;
  bool local_11;
  float local_8;
  
  local_11 = 4 < in_EDI;
  if (local_11) {
    __assert_fail("button >= 0 && button < ((int)(sizeof(g.IO.MouseDown) / sizeof(*g.IO.MouseDown)))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0x11a5,"bool ImGui::IsMouseDragPastThreshold(ImGuiMouseButton, float)");
  }
  local_8 = in_XMM0_Da;
  if (in_XMM0_Da < 0.0) {
    local_8 = (GImGui->IO).MouseDragThreshold;
  }
  return local_8 * local_8 <= (GImGui->IO).MouseDragMaxDistanceSqr[(int)in_EDI];
}

Assistant:

bool ImGui::IsMouseDragPastThreshold(ImGuiMouseButton button, float lock_threshold)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(button >= 0 && button < IM_ARRAYSIZE(g.IO.MouseDown));
    if (lock_threshold < 0.0f)
        lock_threshold = g.IO.MouseDragThreshold;
    return g.IO.MouseDragMaxDistanceSqr[button] >= lock_threshold * lock_threshold;
}